

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
  *pFVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
  *pFVar5;
  bool bVar6;
  double *pdVar7;
  uint uVar8;
  ulong uVar9;
  value_type vVar10;
  value_type vVar11;
  value_type vVar12;
  
  pFVar3 = (fadexpr->fadexpr_).left_;
  uVar1 = (((((pFVar3->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  uVar2 = (((pFVar3->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  pFVar4 = (((fadexpr->fadexpr_).right_)->fadexpr_).right_;
  uVar1 = (((((pFVar4->fadexpr_).left_)->fadexpr_).expr_)->fadexpr_).expr_.dx_.num_elts;
  uVar8 = (((pFVar4->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar8 < (int)uVar1) {
    uVar8 = uVar1;
  }
  if ((int)uVar8 < (int)uVar2) {
    uVar8 = uVar2;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar8 == uVar1) {
    if (uVar8 == 0) goto LAB_0142358c;
    pdVar7 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar8 == 0) {
      if (uVar1 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_0142358c;
    }
    if (uVar1 != 0) {
      pdVar7 = (this->dx_).ptr_to_data;
      if (pdVar7 != (double *)0x0) {
        operator_delete__(pdVar7);
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar8;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar8) {
      uVar9 = (ulong)uVar8 << 3;
    }
    pdVar7 = (double *)operator_new__(uVar9);
    (this->dx_).ptr_to_data = pdVar7;
  }
  bVar6 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>_>
          ::hasFastAccess(&fadexpr->fadexpr_);
  if (bVar6) {
    if (0 < (int)uVar8) {
      uVar9 = 0;
      do {
        vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
                 ::fastAccessDx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar9);
        pFVar5 = (fadexpr->fadexpr_).right_;
        vVar11 = FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
                 ::fastAccessDx(&((pFVar5->fadexpr_).right_)->fadexpr_,(int)uVar9);
        pdVar7[uVar9] = vVar11 * (pFVar5->fadexpr_).left_.constant_ + vVar10;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
  }
  else if (0 < (int)uVar8) {
    uVar9 = 0;
    do {
      vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
               ::dx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar9);
      pFVar5 = (fadexpr->fadexpr_).right_;
      vVar11 = FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
               ::dx(&((pFVar5->fadexpr_).right_)->fadexpr_,(int)uVar9);
      pdVar7[uVar9] = vVar11 * (pFVar5->fadexpr_).left_.constant_ + vVar10;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
LAB_0142358c:
  vVar12 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>_>
           ::val(&fadexpr->fadexpr_);
  this->val_ = vVar12;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}